

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

HighsStatus __thiscall HEkkDual::solve(HEkkDual *this,bool pass_force_phase2)

{
  HighsLogOptions *pHVar1;
  double *pdVar2;
  HighsInt *pHVar3;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  double dVar4;
  uint uVar5;
  int iVar6;
  HighsOptions *pHVar7;
  bool bVar8;
  HighsDebugStatus HVar9;
  HighsStatus HVar10;
  HighsStatus HVar11;
  int iVar12;
  char *format;
  byte bVar13;
  ulong uVar14;
  HEkk *this_01;
  HEkk *pHVar15;
  HEkkPrimal primal_solver;
  string local_748;
  string local_728;
  string local_708;
  HighsLogOptions local_6e8;
  HEkkPrimal local_680;
  
  initialiseSolve(this);
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"Initialise","");
  HVar9 = debugDualSimplex(this,&local_708,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p);
  }
  this_01 = this->ekk_instance_;
  if (HVar9 != kLogicalError) {
    bVar8 = HEkk::isUnconstrainedLp(this_01);
    this_01 = this->ekk_instance_;
    if (!bVar8) {
      pHVar7 = this_01->options_;
      bVar8 = dualInfoOk(this,&this_01->lp_);
      if (bVar8) {
        possiblyUseLiDualSteepestEdge(this);
        if ((this_01->status_).has_invert == false) {
          format = "HDual:: Should enter solve with INVERT\n";
          goto LAB_0034f5c7;
        }
        HEkk::initialiseCost(this->ekk_instance_,kDual,-1,false);
        HEkk::computeDual(this->ekk_instance_);
        HEkk::computeSimplexDualInfeasible(this->ekk_instance_);
        uVar5 = (this_01->info_).num_dual_infeasibilities;
        bVar8 = true;
        if (!pass_force_phase2) {
          dVar4 = (this_01->info_).max_dual_infeasibility;
          bVar8 = dVar4 * dVar4 <
                  (this->ekk_instance_->options_->super_HighsOptionsStruct).
                  dual_feasibility_tolerance;
        }
        this->force_phase2 = bVar8;
        pHVar15 = this->ekk_instance_;
        if (pHVar15->debug_dual_feasible == true && uVar5 != 0) {
          pHVar1 = &(pHVar7->super_HighsOptionsStruct).log_options;
          highsLogDev(pHVar1,kWarning,
                      "Basis should be dual feasible, but duals without cost perturbation have num / max / sum = %4d / %g / %g infeasibilities"
                      ,(this_01->info_).max_dual_infeasibility,
                      (this_01->info_).sum_dual_infeasibilities,(ulong)uVar5);
          if (this->force_phase2 == false) {
            highsLogDev(pHVar1,kWarning,
                        " !!Not forcing phase 2!! basis Id = %d; update count = %d; name = %s\n",
                        (ulong)(uint)(pHVar15->basis_).debug_id,
                        (ulong)(uint)(pHVar15->basis_).debug_update_count,
                        (pHVar15->basis_).debug_origin_name._M_dataplus._M_p);
          }
          else {
            highsLogDev(pHVar1,kWarning,"\n");
          }
        }
        if (((uVar5 == 0) || ((this->force_phase2 & 1U) != 0)) &&
           ((this_01->info_).num_primal_infeasibilities < 1000)) {
          pdVar2 = &(this_01->info_).max_primal_infeasibility;
          uVar14 = CONCAT71((int7)((ulong)pHVar15 >> 8),*pdVar2 <= 0.001 && *pdVar2 != 0.001);
        }
        else {
          uVar14 = 0;
        }
        bVar13 = (byte)uVar14;
        if (bVar13 != 0) {
          highsLogDev(&(pHVar7->super_HighsOptionsStruct).log_options,kDetailed,
                      "Dual feasible with unperturbed costs and num / max / sum primal infeasibilities of %d / %g / %g, so near-optimal\n"
                      ,(this_01->info_).max_primal_infeasibility,
                      (this_01->info_).sum_primal_infeasibilities,
                      (ulong)(uint)(this_01->info_).num_primal_infeasibilities);
        }
        if ((bool)(bVar13 ^ 1) == false) {
          highsLogDev(&(pHVar7->super_HighsOptionsStruct).log_options,kDetailed,
                      "Near-optimal, so don\'t use cost perturbation\n");
        }
        HEkk::initialiseCost(this->ekk_instance_,kDual,-1,(bool)(bVar13 ^ 1));
        bVar8 = HEkk::bailout(this->ekk_instance_);
        if (bVar8) {
          this_01 = this->ekk_instance_;
          HVar10 = kWarning;
          goto LAB_0034f5df;
        }
        pHVar15 = this->ekk_instance_;
        if ((this_01->status_).has_dual_steepest_edge_weights == true) {
          local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"before solve","");
          HEkk::devDebugDualSteepestEdgeWeights(pHVar15,&local_728);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_728._M_dataplus._M_p != &local_728.field_2) {
            operator_delete(local_728._M_dataplus._M_p);
          }
        }
        else {
          local_680.ekk_instance_ = (HEkk *)0x3ff0000000000000;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    (&pHVar15->dual_edge_weight_,(long)this->solver_num_row,
                     (value_type_conflict1 *)&local_680);
          std::vector<double,_std::allocator<double>_>::resize
                    (&this->ekk_instance_->scattered_dual_edge_weight_,(long)this->solver_num_tot);
          if (this->edge_weight_mode == kSteepestEdge) {
            bVar8 = HEkk::logicalBasis(this->ekk_instance_);
            if (!bVar8) {
              pHVar1 = &(pHVar7->super_HighsOptionsStruct).log_options;
              if (bVar13 != 0) {
                highsLogDev(pHVar1,kDetailed,
                            "Basis is not logical, but near-optimal, so use Devex rather than compute steepest edge weights\n"
                           );
                this->edge_weight_mode = kDevex;
                goto LAB_0034f7e3;
              }
              highsLogDev(pHVar1,kDetailed,
                          "Basis is not logical, so compute steepest edge weights\n");
              HEkk::computeDualSteepestEdgeWeights(this->ekk_instance_,true);
            }
            (this_01->status_).has_dual_steepest_edge_weights = true;
          }
LAB_0034f7e3:
          if (this->edge_weight_mode == kDevex) {
            initialiseDevexFramework(this);
          }
        }
        std::vector<double,_std::allocator<double>_>::resize
                  (&(this_01->info_).backtracking_basis_edge_weight_,(long)this->solver_num_tot);
        if (bVar13 == 0) {
          HEkk::computeDual(this->ekk_instance_);
          computeDualInfeasibilitiesWithFixedVariableFlips(this);
          this->dualInfeasCount = (this_01->info_).num_dual_infeasibilities;
        }
        iVar12 = (byte)(this->dualInfeasCount < 1 | this->force_phase2) + 1;
        this->solve_phase = iVar12;
        HVar9 = HEkk::debugOkForSolve(this->ekk_instance_,kDual,iVar12);
        if (HVar9 != kLogicalError) {
          do {
            HVar10 = (HighsStatus)uVar14;
            iVar12 = this->solve_phase;
            if (iVar12 == 0) goto LAB_0034fa02;
            pHVar15 = this->ekk_instance_;
            iVar6 = pHVar15->iteration_count_;
            (this_01->status_).has_dual_objective_value = false;
            if (iVar12 == -1) {
              HEkk::initialiseBound(pHVar15,kDual,-1,false);
              HEkk::initialiseNonbasicValueAndMove(this->ekk_instance_);
              computeDualInfeasibilitiesWithFixedVariableFlips(this);
              iVar12 = (this_01->info_).num_dual_infeasibilities;
              this->dualInfeasCount = iVar12;
              iVar12 = (iVar12 < 1) + 1;
              this->solve_phase = iVar12;
              if ((this_01->info_).backtracking_ == true) {
                HEkk::initialiseBound(this->ekk_instance_,kDual,iVar12,false);
                HEkk::initialiseNonbasicValueAndMove(this->ekk_instance_);
                (this_01->info_).backtracking_ = false;
              }
            }
            if (this->solve_phase != 2) {
              if (this->solve_phase == 1) {
                HighsSimplexAnalysis::simplexTimerStart(this->analysis,2,0);
                solvePhase1(this);
                HighsSimplexAnalysis::simplexTimerStop(this->analysis,2,0);
                pHVar3 = &(this_01->info_).dual_phase1_iteration_count;
                *pHVar3 = *pHVar3 + (this->ekk_instance_->iteration_count_ - iVar6);
                goto LAB_0034f97d;
              }
              this_01->model_status_ = kSolveError;
              pHVar15 = this->ekk_instance_;
switchD_0034f9b9_caseD_fffffffd:
              HVar10 = HEkk::returnFromSolve(pHVar15,kError);
              uVar14 = (ulong)(uint)HVar10;
              iVar12 = 1;
              goto switchD_0034f9b9_caseD_fffffffe;
            }
            HighsSimplexAnalysis::simplexTimerStart(this->analysis,3,0);
            solvePhase2(this);
            HighsSimplexAnalysis::simplexTimerStop(this->analysis,3,0);
            pHVar3 = &(this_01->info_).dual_phase2_iteration_count;
            *pHVar3 = *pHVar3 + (this->ekk_instance_->iteration_count_ - iVar6);
LAB_0034f97d:
            pHVar15 = this->ekk_instance_;
            if (pHVar15->solve_bailout_ == true) {
LAB_0034f98a:
              iVar12 = 1;
              HVar10 = HEkk::returnFromSolve(pHVar15,kWarning);
              uVar14 = (ulong)(uint)HVar10;
            }
            else {
              iVar12 = 3;
              switch(this->solve_phase) {
              case 5:
                pHVar15->model_status_ = kUnknown;
                goto LAB_0034f98a;
              case -3:
                goto switchD_0034f9b9_caseD_fffffffd;
              case -2:
              case 3:
              case 4:
                break;
              default:
                iVar12 = 0;
              }
            }
switchD_0034f9b9_caseD_fffffffe:
            HVar10 = (HighsStatus)uVar14;
          } while (iVar12 == 0);
          if (iVar12 != 3) {
            return HVar10;
          }
LAB_0034fa02:
          iVar12 = this->solve_phase;
          if (iVar12 - 3U < 2) {
            pHVar15 = this->ekk_instance_;
            pHVar3 = &pHVar15->dual_simplex_cleanup_level_;
            *pHVar3 = *pHVar3 + 1;
            if (iVar12 == 3) {
              HEkk::computeSimplexInfeasible(pHVar15);
            }
            pHVar1 = &(pHVar7->super_HighsOptionsStruct).log_options;
            if ((pHVar7->super_HighsOptionsStruct).max_dual_simplex_cleanup_level <
                this->ekk_instance_->dual_simplex_cleanup_level_) {
              highsLogDev(pHVar1,kWarning,
                          "HEkkDual:: Cannot use level %d primal simplex cleanup for %d dual infeasibilities\n"
                         );
              this->ekk_instance_->model_status_ = (this->solve_phase != 4) + kOptimal;
            }
            else {
              highsLogDev(pHVar1,kInfo,
                          "HEkkDual:: Using primal simplex to try to clean up num / max / sum = %d / %g / %g dual infeasibilities\n"
                          ,(this_01->info_).max_dual_infeasibility,
                          (this_01->info_).sum_dual_infeasibilities,
                          (ulong)(uint)(this_01->info_).num_dual_infeasibilities);
              HighsSimplexAnalysis::simplexTimerStart(this->analysis,5,0);
              dVar4 = (this_01->info_).primal_simplex_bound_perturbation_multiplier;
              (this_01->info_).primal_simplex_bound_perturbation_multiplier = 0.0;
              HEkkPrimal::HEkkPrimal(&local_680,this->ekk_instance_);
              HVar11 = HEkkPrimal::solve(&local_680,true);
              (this_01->info_).primal_simplex_bound_perturbation_multiplier = dVar4;
              HighsSimplexAnalysis::simplexTimerStop(this->analysis,5,0);
              local_6e8.log_stream = pHVar1->log_stream;
              local_6e8.output_flag = (pHVar7->super_HighsOptionsStruct).log_options.output_flag;
              local_6e8.log_to_console =
                   (pHVar7->super_HighsOptionsStruct).log_options.log_to_console;
              local_6e8.log_dev_level = (pHVar7->super_HighsOptionsStruct).log_options.log_dev_level
              ;
              local_6e8.user_log_callback =
                   (pHVar7->super_HighsOptionsStruct).log_options.user_log_callback;
              local_6e8.user_log_callback_data =
                   (pHVar7->super_HighsOptionsStruct).log_options.user_log_callback_data;
              this_00 = &local_6e8.user_callback;
              std::
              function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
              ::function(this_00,&(pHVar7->super_HighsOptionsStruct).log_options.user_callback);
              local_6e8.user_callback_active =
                   (pHVar7->super_HighsOptionsStruct).log_options.user_callback_active;
              local_6e8.user_callback_data =
                   (pHVar7->super_HighsOptionsStruct).log_options.user_callback_data;
              local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_748,"HEkkPrimal::solve","");
              HVar11 = interpretCallStatus(&local_6e8,HVar11,kOk,&local_748);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_748._M_dataplus._M_p != &local_748.field_2) {
                operator_delete(local_748._M_dataplus._M_p);
              }
              if (local_6e8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
                (*local_6e8.user_callback.super__Function_base._M_manager)
                          ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
              }
              pHVar15 = this->ekk_instance_;
              pHVar15->called_return_from_solve_ = false;
              if (HVar11 == kOk) {
                if ((pHVar15->model_status_ == kOptimal) &&
                   ((this_01->info_).num_primal_infeasibilities +
                    (this_01->info_).num_dual_infeasibilities != 0)) {
                  highsLogDev(pHVar1,kWarning,
                              "HEkkDual:: Primal simplex clean up yields optimality, but with %d (max %g) primal infeasibilities and d (max %g) dual infeasibilities\n"
                              ,(this_01->info_).max_primal_infeasibility,
                              (this_01->info_).max_dual_infeasibility);
                }
              }
              else {
                HVar10 = HEkk::returnFromSolve(pHVar15,HVar11);
              }
              HEkkPrimal::~HEkkPrimal(&local_680);
              if (HVar11 != kOk) {
                return HVar10;
              }
            }
          }
          HVar9 = HEkk::debugOkForSolve(this->ekk_instance_,kDual,this->solve_phase);
          this_01 = this->ekk_instance_;
          if (HVar9 != kLogicalError) {
            HVar10 = kOk;
            goto LAB_0034f5df;
          }
          goto LAB_0034f5da;
        }
      }
      else {
        format = "HPrimalDual::solve has error in dual information\n";
LAB_0034f5c7:
        highsLogDev(&(pHVar7->super_HighsOptionsStruct).log_options,kError,format);
      }
      this_01 = this->ekk_instance_;
    }
  }
LAB_0034f5da:
  HVar10 = kError;
LAB_0034f5df:
  HVar10 = HEkk::returnFromSolve(this_01,HVar10);
  return HVar10;
}

Assistant:

HighsStatus HEkkDual::solve(const bool pass_force_phase2) {
  // Initialise control data for a particular solve
  initialiseSolve();

  if (debugDualSimplex("Initialise", true) == HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  // Assumes that the LP has a positive number of rows
  if (ekk_instance_.isUnconstrainedLp())
    return ekk_instance_.returnFromSolve(HighsStatus::kError);

  HighsOptions& options = *ekk_instance_.options_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexStatus& status = ekk_instance_.status_;
  HighsModelStatus& model_status = ekk_instance_.model_status_;

  if (!dualInfoOk(ekk_instance_.lp_)) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "HPrimalDual::solve has error in dual information\n");
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  }

  // Possibly use Li dual steepest edge weights by not storing squared
  // primal infeasibilities
  possiblyUseLiDualSteepestEdge();

  assert(status.has_invert);
  if (!status.has_invert) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "HDual:: Should enter solve with INVERT\n");
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  }

  // Determine the duals without cost perturbation
  ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhaseUnknown);
  ekk_instance_.computeDual();
  ekk_instance_.computeSimplexDualInfeasible();
  // Record whether the solution with unperturbed costs is dual feasible
  const bool dual_feasible_with_unperturbed_costs =
      info.num_dual_infeasibilities == 0;
  // Force phase 2 if dual infeasibilities without cost perturbation
  // involved fixed variables or were (at most) small
  force_phase2 = pass_force_phase2 ||
                 info.max_dual_infeasibility * info.max_dual_infeasibility <
                     ekk_instance_.options_->dual_feasibility_tolerance;
  // Within the MIP solver, unless the basis supplied was alien, the
  // simplex solver should be able to start from dual feasibility, so
  // possibly debug this property. Note that debug_dual_feasible is
  // set in HEkk::setBasis, and is false if kDebugMipNodeDualFeasible
  // is false
  if (ekk_instance_.debug_dual_feasible &&
      !dual_feasible_with_unperturbed_costs) {
    SimplexBasis& basis = ekk_instance_.basis_;
    highsLogDev(
        options.log_options, HighsLogType::kWarning,
        "Basis should be dual feasible, but duals without cost perturbation "
        "have num / max / sum = %4d / %g / %g infeasibilities",
        (int)info.num_dual_infeasibilities, info.max_dual_infeasibility,
        info.sum_dual_infeasibilities);
    if (!force_phase2) {
      highsLogDev(options.log_options, HighsLogType::kWarning,
                  " !!Not forcing phase 2!! basis Id = %d; update count = %d; "
                  "name = %s\n",
                  (int)basis.debug_id, (int)basis.debug_update_count,
                  basis.debug_origin_name.c_str());
    } else {
      highsLogDev(options.log_options, HighsLogType::kWarning, "\n");
    }
  }
  // Determine whether the solution is near-optimal. Values 1000 and
  // 1e-3 (ensuring sum<1) are unimportant, as the sum of primal
  // infeasibilities for near-optimal solutions is typically many
  // orders of magnitude smaller than 1, and the sum of primal
  // infeasibilities will be very much larger for non-trivial LPs
  // that are dual feasible for a logical or crash basis.
  //
  // Consider there to be no dual infeasibilities if there are none,
  // or if phase 2 is forced, in which case any dual infeasibilities
  // will be shifted
  const bool no_simplex_dual_infeasibilities =
      dual_feasible_with_unperturbed_costs || force_phase2;
  const bool near_optimal = no_simplex_dual_infeasibilities &&
                            info.num_primal_infeasibilities < 1000 &&
                            info.max_primal_infeasibility < 1e-3;
  if (near_optimal)
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "Dual feasible with unperturbed costs and num / max / sum "
                "primal infeasibilities of "
                "%" HIGHSINT_FORMAT
                " / %g "
                "/ %g, so near-optimal\n",
                info.num_primal_infeasibilities, info.max_primal_infeasibility,
                info.sum_primal_infeasibilities);

  // Perturb costs according to whether the solution is near-optimal
  const bool perturb_costs = !near_optimal;
  if (!perturb_costs)
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "Near-optimal, so don't use cost perturbation\n");
  ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhaseUnknown,
                               perturb_costs);
  // Check whether the time/iteration limit has been reached. First
  // point at which a non-error return can occur
  if (ekk_instance_.bailout())
    return ekk_instance_.returnFromSolve(HighsStatus::kWarning);

  // Consider initialising edge weights
  if (status.has_dual_steepest_edge_weights) {
    // Dual steepest edge weights are known, so possibly check
    assert((HighsInt)ekk_instance_.dual_edge_weight_.size() >= solver_num_row);
    assert((HighsInt)ekk_instance_.scattered_dual_edge_weight_.size() >=
           solver_num_tot);
    ekk_instance_.devDebugDualSteepestEdgeWeights("before solve");
  } else {
    // Set up edge weights
    //
    // Assign unit weights - necessary for Dantzig and Devex, and
    // correct for steepest edge when B=I so, for clarity, do it for
    // all. Also ensure that the scattering vector is the right size
    ekk_instance_.dual_edge_weight_.assign(solver_num_row, 1.0);
    ekk_instance_.scattered_dual_edge_weight_.resize(solver_num_tot);
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      // Intending to using dual steepest edge weights
      //
      // Exact DSE weights need to be computed if the basis contains
      // structurals
      if (ekk_instance_.logicalBasis()) {
        // Unit weights already set up for B=I
        status.has_dual_steepest_edge_weights = true;
      } else {
        // Non-logical basis
        if (near_optimal) {
          // Use Devex rather than compute steepest edge weights
          highsLogDev(
              options.log_options, HighsLogType::kDetailed,
              "Basis is not logical, but near-optimal, so use Devex rather "
              "than compute steepest edge weights\n");
          edge_weight_mode = EdgeWeightMode::kDevex;
          assert(!status.has_dual_steepest_edge_weights);
        } else {
          // Compute steepest edge weights
          highsLogDev(
              options.log_options, HighsLogType::kDetailed,
              "Basis is not logical, so compute steepest edge weights\n");
          ekk_instance_.computeDualSteepestEdgeWeights(true);
          status.has_dual_steepest_edge_weights = true;
        }
      }
    }
    if (edge_weight_mode == EdgeWeightMode::kDevex) initialiseDevexFramework();
    // Check on consistency between edge_weight_mode and
    // status.has_dual_steepest_edge_weights
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      assert(status.has_dual_steepest_edge_weights);
    } else {
      assert(!status.has_dual_steepest_edge_weights);
    }
  }
  // Resize the copy of scattered edge weights for backtracking
  info.backtracking_basis_edge_weight_.resize(solver_num_tot);

  if (perturb_costs) {
    // Compute the dual values with perturbed costs
    ekk_instance_.computeDual();
    // Determine the number of dual infeasibilities after fixed
    // variable flips
    computeDualInfeasibilitiesWithFixedVariableFlips();
    dualInfeasCount = info.num_dual_infeasibilities;
  }

  // Determine the solve phase
  if (force_phase2) {
    // Dual infeasibilities without cost perturbation involved
    // fixed variables or were (at most) small, so can easily be
    // removed by flips for fixed variables and shifts for the rest
    solve_phase = kSolvePhase2;
  } else {
    // Phase depends on the number of dual infeasibilities after fixed
    // variable flips
    solve_phase = dualInfeasCount > 0 ? kSolvePhase1 : kSolvePhase2;
  }
  if (ekk_instance_.debugOkForSolve(SimplexAlgorithm::kDual, solve_phase) ==
      HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  //
  // The major solving loop
  //
  while (solve_phase) {
    HighsInt it0 = ekk_instance_.iteration_count_;
    // When starting a new phase the (updated) dual objective function
    // value isn't known. Indicate this so that when the value
    // computed from scratch in rebuild() isn't checked against the
    // the updated value
    status.has_dual_objective_value = false;
    if (solve_phase == kSolvePhaseUnknown) {
      // Reset the phase 2 bounds so that true number of dual
      // infeasibilities can be determined
      ekk_instance_.initialiseBound(SimplexAlgorithm::kDual,
                                    kSolvePhaseUnknown);
      ekk_instance_.initialiseNonbasicValueAndMove();
      // Determine the number of unavoidable dual infeasibilities, and
      // hence the solve phase
      computeDualInfeasibilitiesWithFixedVariableFlips();
      dualInfeasCount = info.num_dual_infeasibilities;
      solve_phase = dualInfeasCount > 0 ? kSolvePhase1 : kSolvePhase2;
      if (info.backtracking_) {
        // Backtracking, so set the bounds and primal values
        ekk_instance_.initialiseBound(SimplexAlgorithm::kDual, solve_phase);
        ekk_instance_.initialiseNonbasicValueAndMove();
        // Can now forget that we might have been backtracking
        info.backtracking_ = false;
      }
    }
    assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
    if (solve_phase == kSolvePhase1) {
      // Phase 1
      analysis->simplexTimerStart(SimplexDualPhase1Clock);
      solvePhase1();
      analysis->simplexTimerStop(SimplexDualPhase1Clock);
      info.dual_phase1_iteration_count +=
          (ekk_instance_.iteration_count_ - it0);
    } else if (solve_phase == kSolvePhase2) {
      // Phase 2
      analysis->simplexTimerStart(SimplexDualPhase2Clock);
      solvePhase2();
      analysis->simplexTimerStop(SimplexDualPhase2Clock);
      info.dual_phase2_iteration_count +=
          (ekk_instance_.iteration_count_ - it0);
    } else {
      // Should only be kSolvePhase1 or kSolvePhase2
      model_status = HighsModelStatus::kSolveError;
      return ekk_instance_.returnFromSolve(HighsStatus::kError);
    }
    // Return if bailing out from solve
    if (ekk_instance_.solve_bailout_)
      return ekk_instance_.returnFromSolve(HighsStatus::kWarning);
    // Can have all possible cases of solve_phase
    assert(solve_phase >= kSolvePhaseMin && solve_phase <= kSolvePhaseMax);
    // Look for scenarios when the major solving loop ends
    if (solve_phase == kSolvePhaseTabooBasis) {
      // Only basis change is taboo
      ekk_instance_.model_status_ = HighsModelStatus::kUnknown;
      return ekk_instance_.returnFromSolve(HighsStatus::kWarning);
    }
    if (solve_phase == kSolvePhaseError) {
      // Solver error so return HighsStatus::kError
      assert(model_status == HighsModelStatus::kSolveError);
      return ekk_instance_.returnFromSolve(HighsStatus::kError);
    }
    if (solve_phase == kSolvePhaseExit) {
      // LP identified as not having an optimal solution
      assert(model_status == HighsModelStatus::kUnboundedOrInfeasible ||
             model_status == HighsModelStatus::kInfeasible);
      break;
    }
    if (solve_phase == kSolvePhaseOptimalCleanup ||
        solve_phase == kSolvePhasePrimalInfeasibleCleanup) {
      // Dual infeasibilities after phase 2 which ends either
      //
      // primal feasible with dual infeasibilities, so use primal
      // simplex to clean up expecting to identify optimality
      //
      // primal infeasible with dual infeasibilities so use primal
      // simplex to clean up expecting to identify (primal)
      // infeasibility
      break;
    }
    // If solve_phase == kSolvePhaseOptimal == 0 then major solving
    // loop ends naturally since solve_phase is false
  }
  // If bailing out, should have returned already
  assert(!ekk_instance_.solve_bailout_);
  // Should only have these cases
  assert(solve_phase == kSolvePhaseExit || solve_phase == kSolvePhaseUnknown ||
         solve_phase == kSolvePhaseOptimal ||
         solve_phase == kSolvePhaseOptimalCleanup ||
         solve_phase == kSolvePhasePrimalInfeasibleCleanup);
  // Can't be solve_phase == kSolvePhase1 since this requires simplex
  // solver to have continued after identifying dual infeasibility.
  if (solve_phase == kSolvePhaseOptimalCleanup ||
      solve_phase == kSolvePhasePrimalInfeasibleCleanup) {
    ekk_instance_.dual_simplex_cleanup_level_++;
    if (solve_phase == kSolvePhasePrimalInfeasibleCleanup) {
      // Primal and dual infeasibilities aren't known when cleaning up
      // after suspected unboundedness in dual phase 2. All that's
      // known is that cost shifting was required to get dual
      // feasibility after removing cost perturbations, and dual
      // simplex iterations may also have been done. This is unlike
      // clean-up of dual infeasibilities after suspected optimality,
      // when no shifting and dual simplex iterations are done after
      // removing cost perturbations.
      //
      // Determine the primal and dual infeasibilities
      ekk_instance_.computeSimplexInfeasible();
    }
    if (ekk_instance_.dual_simplex_cleanup_level_ >
        options.max_dual_simplex_cleanup_level) {
      // No clean up. Dual simplex was optimal or unbounded with
      // unperturbed costs, so say that the scaled LP has been solved
      // optimally. Optimality or infeasibility for the unscaled LP
      // are unlikely but will still be assessed honestly, so leave it
      // to the user to decide whether the solution can be accepted.
      highsLogDev(options.log_options, HighsLogType::kWarning,
                  "HEkkDual:: Cannot use level %" HIGHSINT_FORMAT
                  " primal simplex cleanup for %" HIGHSINT_FORMAT
                  " dual infeasibilities\n",
                  ekk_instance_.dual_simplex_cleanup_level_,
                  info.num_dual_infeasibilities);
      if (solve_phase == kSolvePhaseOptimalCleanup) {
        ekk_instance_.model_status_ = HighsModelStatus::kOptimal;
      } else {
        ekk_instance_.model_status_ = HighsModelStatus::kInfeasible;
      }
    } else {
      // Use primal simplex to clean up. This usually yields
      // optimality or infeasibility (according to whether solve_phase
      // is kSolvePhaseOptimalCleanup or
      // kSolvePhasePrimalInfeasibleCleanup) but can yield
      // unboundedness. Time/iteration limit return is, of course,
      // possible, as are solver error
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "HEkkDual:: Using primal simplex to try to clean up num / "
                  "max / sum = %" HIGHSINT_FORMAT
                  " / %g / %g dual infeasibilities\n",
                  info.num_dual_infeasibilities, info.max_dual_infeasibility,
                  info.sum_dual_infeasibilities);
      HighsStatus return_status = HighsStatus::kOk;
      analysis->simplexTimerStart(SimplexPrimalPhase2Clock);
      // Switch off any bound perturbation
      double save_primal_simplex_bound_perturbation_multiplier =
          info.primal_simplex_bound_perturbation_multiplier;
      info.primal_simplex_bound_perturbation_multiplier = 0;
      HEkkPrimal primal_solver(ekk_instance_);
      HighsStatus call_status = primal_solver.solve(true);
      // Restore any bound perturbation
      info.primal_simplex_bound_perturbation_multiplier =
          save_primal_simplex_bound_perturbation_multiplier;
      analysis->simplexTimerStop(SimplexPrimalPhase2Clock);
      assert(ekk_instance_.called_return_from_solve_);
      return_status = interpretCallStatus(options.log_options, call_status,
                                          return_status, "HEkkPrimal::solve");
      // Reset called_return_from_solve_ to be false, since it's
      // called for this solve
      ekk_instance_.called_return_from_solve_ = false;
      if (return_status != HighsStatus::kOk)
        return ekk_instance_.returnFromSolve(return_status);
      if (ekk_instance_.model_status_ == HighsModelStatus::kOptimal &&
          info.num_primal_infeasibilities + info.num_dual_infeasibilities)
        highsLogDev(options.log_options, HighsLogType::kWarning,
                    "HEkkDual:: Primal simplex clean up yields optimality, "
                    "but with %" HIGHSINT_FORMAT
                    " (max %g) primal infeasibilities and " HIGHSINT_FORMAT
                    " (max %g) dual infeasibilities\n",
                    info.num_primal_infeasibilities,
                    info.max_primal_infeasibility,
                    info.num_dual_infeasibilities, info.max_dual_infeasibility);
    }
  }
  assert(model_status == HighsModelStatus::kOptimal ||
         model_status == HighsModelStatus::kInfeasible ||
         model_status == HighsModelStatus::kUnbounded ||
         model_status == HighsModelStatus::kUnboundedOrInfeasible);
  if (ekk_instance_.debugOkForSolve(SimplexAlgorithm::kDual, solve_phase) ==
      HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  return ekk_instance_.returnFromSolve(HighsStatus::kOk);
}